

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

void __thiscall simple_thread_pool::ThreadPoolMgr::loop(ThreadPoolMgr *this)

{
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  ThreadHandle *__tmp;
  pthread_t __target_thread;
  size_t time_us;
  shared_ptr<simple_thread_pool::ThreadHandle> thread_to_assign;
  shared_ptr<simple_thread_pool::TaskHandle> task_to_run;
  uint64_t next_sleep_us;
  ThreadHandle *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined1 local_58 [36];
  TaskResult local_34;
  
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"stp_coord");
  local_58._24_8_ = this->MAX_SLEEP_US;
  if (((this->stopSignal)._M_base._M_i & 1U) == 0) {
    do {
      psVar1 = &(this->myOpt).busyWaitingIntervalUs;
      time_us = local_58._24_8_ - *psVar1;
      if (*psVar1 <= (ulong)local_58._24_8_ && time_us != 0) {
        EventAwaiter::wait_us(&this->eaLoop,time_us);
      }
      if (((this->stopSignal)._M_base._M_i & 1U) != 0) {
        return;
      }
      LOCK();
      (this->eaLoop).status._M_i = idle;
      UNLOCK();
      local_58._24_8_ = this->MAX_SLEEP_US;
      local_68 = (ThreadHandle *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((this->myOpt).numInitialThreads == 0) {
LAB_00103c96:
        (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[4])
                  ((ThreadPoolMgr *)local_58,this,local_58 + 0x18);
        if ((ThreadHandle *)local_58._0_8_ == (ThreadHandle *)0x0) {
          if (local_68 != (ThreadHandle *)0x0) {
            (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[2])(this,&local_68);
          }
        }
        else if ((this->myOpt).numInitialThreads == 0) {
          local_34.val = OK;
          TaskHandle::execute((TaskHandle *)local_58._0_8_,&local_34);
        }
        else {
          ThreadHandle::assign(local_68,(shared_ptr<simple_thread_pool::TaskHandle> *)local_58);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
      }
      else {
        popThread((ThreadPoolMgr *)local_58);
        uVar2 = local_58._8_8_;
        local_68 = (ThreadHandle *)local_58._0_8_;
        this_00 = p_Stack_60;
        local_58._0_8_ = (ThreadHandle *)0x0;
        local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
        if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        if (local_68 != (ThreadHandle *)0x0) goto LAB_00103c96;
      }
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
    } while (((this->stopSignal)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void loop() {
#ifdef __linux__
        pthread_setname_np(pthread_self(), "stp_coord");
#endif
        uint64_t next_sleep_us = MAX_SLEEP_US;

        while (!stopSignal) {
            if (next_sleep_us > myOpt.busyWaitingIntervalUs) {
                eaLoop.wait_us(next_sleep_us - myOpt.busyWaitingIntervalUs);
            } else {
                // Otherwise: busy waiting.
            }
            if (stopSignal) break;

            eaLoop.reset();
            next_sleep_us = MAX_SLEEP_US;

            std::shared_ptr<ThreadHandle> thread_to_assign = nullptr;

            if (myOpt.numInitialThreads) {
                // Thread pool exists, pick an idle thread.
                thread_to_assign = popThread();
                if (!thread_to_assign) {
                    // All threads are busy, skip.
                    continue;
                }
            }
            // Otherwise (empty thread pool),
            // this loop thread will do execution.

            // Check timer task first (higher priority).
            std::shared_ptr<TaskHandle> task_to_run = getTaskToRun(&next_sleep_us);

            if (!task_to_run) {
                // No task to run, skip.
                if (thread_to_assign) {
                    // Return the thread to idle list.
                    returnThread(thread_to_assign);
                }
                continue;
            }

            if (myOpt.numInitialThreads) {
                // Assign the task to picked thread.
                thread_to_assign->assign(task_to_run);
            } else {
                // Empty thread pool, execute here.
                task_to_run->execute(TaskResult());
            }
        }
    }